

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink)

{
  unsigned_long *puVar1;
  cmGlobalUnixMakefileGenerator3 *this_00;
  pointer pbVar2;
  cmGeneratorTarget *pcVar3;
  cmMakefile *pcVar4;
  cmLocalUnixMakefileGenerator3 *pcVar5;
  bool bVar6;
  bool useResponseFile;
  bool forResponse;
  bool useWatcomQuote;
  LinkClosure *pLVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  char *pcVar9;
  string *psVar10;
  string *psVar11;
  cmLinkLineComputer *this_01;
  undefined4 extraout_var;
  cmOutputConverter *pcVar12;
  string *real_link_command;
  pointer __rhs;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string linkLanguage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string flags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  real_link_commands;
  string targetFullPathCompilePDB;
  string linkFlags;
  string linkRuleVar;
  string targetOutputReal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exeCleanFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string linkLibs;
  string launcher;
  string target;
  string objectDir;
  EchoProgress progress;
  string local_f0;
  string buildObjs;
  string cuda_lang;
  string targetOutPathCompilePDB;
  string linkRule;
  string objExt;
  
  this_00 = (this->super_cmMakefileTargetGenerator).GlobalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&progress,"CUDA",(allocator<char> *)&cuda_lang);
  bVar6 = cmGlobalGenerator::GetLanguageEnabled((cmGlobalGenerator *)this_00,&progress.Dir);
  std::__cxx11::string::~string((string *)&progress);
  if (bVar6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cuda_lang,"CUDA",(allocator<char> *)&progress);
    psVar11 = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
    pLVar7 = cmGeneratorTarget::GetLinkClosure
                       ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget,psVar11);
    _Var8 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((pLVar7->Languages).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (pLVar7->Languages).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&cuda_lang);
    pbVar2 = (pLVar7->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar3 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&progress,"CUDA_RESOLVE_DEVICE_SYMBOLS",(allocator<char> *)&linkLanguage);
    pcVar9 = cmGeneratorTarget::GetProperty(pcVar3,&progress.Dir);
    std::__cxx11::string::~string((string *)&progress);
    if (pcVar9 == (char *)0x0) {
      bVar6 = true;
    }
    else {
      bVar6 = cmSystemTools::IsOn(pcVar9);
    }
    if (bVar6 == true && _Var8._M_current != pbVar2) {
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&linkLanguage,"CUDA",(allocator<char> *)&progress);
      pcVar4 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&progress,"CMAKE_CUDA_OUTPUT_EXTENSION",
                 (allocator<char> *)&targetOutputReal);
      psVar10 = cmMakefile::GetSafeDefinition(pcVar4,&progress.Dir);
      std::__cxx11::string::string((string *)&objExt,(string *)psVar10);
      std::__cxx11::string::~string((string *)&progress);
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmMakefileTargetGenerator::AppendLinkDepends
                (&this->super_cmMakefileTargetGenerator,&depends,&linkLanguage);
      std::operator+(&progress.Dir,
                     &((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget)->ObjectDirectory,"cmake_device_link");
      std::operator+(&targetOutputReal,&progress.Dir,&objExt);
      std::__cxx11::string::~string((string *)&progress);
      std::__cxx11::string::_M_assign((string *)&this->DeviceLinkObject);
      puVar1 = &(this->super_cmMakefileTargetGenerator).NumberOfProgressActions;
      *puVar1 = *puVar1 + 1;
      if ((this->super_cmMakefileTargetGenerator).NoRuleMessages == false) {
        progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
        progress.Dir._M_string_length = 0;
        progress.Dir.field_2._M_local_buf[0] = '\0';
        progress.Arg._M_dataplus._M_p = (pointer)&progress.Arg.field_2;
        progress.Arg._M_string_length = 0;
        progress.Arg.field_2._M_allocated_capacity =
             progress.Arg.field_2._M_allocated_capacity & 0xffffffffffffff00;
        cmMakefileTargetGenerator::MakeEchoProgress
                  (&this->super_cmMakefileTargetGenerator,&progress);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&flags,"Linking ",(allocator<char> *)&linkFlags);
        std::__cxx11::string::append((string *)&flags);
        std::__cxx11::string::append((char *)&flags);
        pcVar5 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
        psVar10 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar5)
        ;
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&linkRuleVar,(cmLocalGenerator *)pcVar5,psVar10,&this->DeviceLinkObject);
        cmOutputConverter::ConvertToOutputFormat
                  (&linkFlags,
                   &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&linkRuleVar,SHELL);
        std::__cxx11::string::append((string *)&flags);
        std::__cxx11::string::~string((string *)&linkFlags);
        std::__cxx11::string::~string((string *)&linkRuleVar);
        cmLocalUnixMakefileGenerator3::AppendEcho
                  ((this->super_cmMakefileTargetGenerator).LocalGenerator,&commands,&flags,EchoLink,
                   &progress);
        std::__cxx11::string::~string((string *)&flags);
        cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress(&progress);
      }
      flags._M_dataplus._M_p = (pointer)&flags.field_2;
      flags._M_string_length = 0;
      linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
      linkFlags._M_string_length = 0;
      flags.field_2._M_local_buf[0] = '\0';
      linkFlags.field_2._M_local_buf[0] = '\0';
      bVar6 = cmGeneratorTarget::IsExecutableWithExports
                        ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget);
      if (bVar6) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&progress,"CMAKE_EXE_EXPORTS_",(allocator<char> *)&linkRuleVar);
        std::__cxx11::string::append((string *)&progress);
        std::__cxx11::string::append((char *)&progress);
        pcVar5 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
        pcVar9 = cmMakefile::GetDefinition
                           ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                            Makefile,&progress.Dir);
        (*(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
                  (pcVar5,&linkFlags,pcVar9);
        std::__cxx11::string::~string((string *)&progress);
      }
      pcVar5 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      cmLocalGenerator::GetLinkLibsCMP0065
                (&progress.Dir,(cmLocalGenerator *)pcVar5,&linkLanguage,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget);
      (*(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar5,&linkFlags,&progress);
      std::__cxx11::string::~string((string *)&progress);
      cmLocalGenerator::AddLanguageFlagsForLinking
                ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,&flags,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,&linkLanguage,psVar11);
      cmLocalGenerator::AddArchitectureFlags
                ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,&flags,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget,&linkLanguage,psVar11);
      cmMakefileTargetGenerator::GetTargetLinkFlags
                (&this->super_cmMakefileTargetGenerator,&linkFlags,&linkLanguage);
      exeCleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      exeCleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      exeCleanFiles.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar5 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar5);
      cmLocalGenerator::MaybeConvertToRelativePath
                (&progress.Dir,(cmLocalGenerator *)pcVar5,psVar11,&targetOutputReal);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&exeCleanFiles
                 ,&progress.Dir);
      std::__cxx11::string::~string((string *)&progress);
      bVar6 = (((this->super_cmMakefileTargetGenerator).GlobalGenerator)->
              super_cmGlobalCommonGenerator).super_cmGlobalGenerator.UseLinkScript;
      real_link_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      real_link_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      real_link_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&linkRuleVar,"CMAKE_CUDA_DEVICE_LINK_EXECUTABLE",
                 (allocator<char> *)&progress);
      cmMakefileTargetGenerator::GetLinkRule
                (&linkRule,&this->super_cmMakefileTargetGenerator,&linkRuleVar);
      commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      commands1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmSystemTools::ExpandListArgument(&linkRule,&real_link_commands,false);
      useResponseFile =
           cmMakefileTargetGenerator::CheckUseResponseFileForObjects
                     (&this->super_cmMakefileTargetGenerator,&linkLanguage);
      forResponse = cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
                              (&this->super_cmMakefileTargetGenerator,&linkLanguage);
      pcVar4 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
      std::operator+(&progress.Dir,&linkRuleVar,"_USE_WATCOM_QUOTE");
      useWatcomQuote = cmMakefile::IsOn(pcVar4,&progress.Dir);
      std::__cxx11::string::~string((string *)&progress);
      cmOutputConverter::SetLinkScriptShell
                (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                  super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,bVar6
                );
      this_01 = (cmLinkLineComputer *)operator_new(0x40);
      pcVar5 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      pcVar12 = &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
      if (pcVar5 == (cmLocalUnixMakefileGenerator3 *)0x0) {
        pcVar12 = (cmOutputConverter *)0x0;
      }
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&linkLibs,(cmLocalGenerator *)pcVar5);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)&progress,(cmStateSnapshot *)&linkLibs);
      cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
                ((cmLinkLineDeviceComputer *)this_01,pcVar12,(cmStateDirectory *)&progress);
      cmLinkLineComputer::SetForResponse(this_01,forResponse);
      cmLinkLineComputer::SetUseWatcomQuote(this_01,useWatcomQuote);
      cmLinkLineComputer::SetRelink(this_01,relink);
      linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
      linkLibs._M_string_length = 0;
      linkLibs.field_2._M_local_buf[0] = '\0';
      cmMakefileTargetGenerator::CreateLinkLibs
                (&this->super_cmMakefileTargetGenerator,this_01,&linkLibs,forResponse,&depends);
      buildObjs._M_dataplus._M_p = (pointer)&buildObjs.field_2;
      buildObjs._M_string_length = 0;
      buildObjs.field_2._M_local_buf[0] = '\0';
      cmMakefileTargetGenerator::CreateObjectLists
                (&this->super_cmMakefileTargetGenerator,bVar6,false,useResponseFile,&buildObjs,
                 &depends,useWatcomQuote);
      cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)&progress);
      cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
                (&objectDir,
                 (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                 GeneratorTarget);
      pcVar5 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar5);
      cmLocalGenerator::MaybeConvertToRelativePath
                (&targetFullPathCompilePDB,(cmLocalGenerator *)pcVar5,psVar11,&objectDir);
      cmOutputConverter::ConvertToOutputFormat
                (&target,&(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          super_cmOutputConverter,&targetFullPathCompilePDB,SHELL);
      std::__cxx11::string::operator=((string *)&objectDir,(string *)&target);
      std::__cxx11::string::~string((string *)&target);
      std::__cxx11::string::~string((string *)&targetFullPathCompilePDB);
      pcVar5 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar5);
      cmLocalGenerator::MaybeConvertToRelativePath
                (&targetFullPathCompilePDB,(cmLocalGenerator *)pcVar5,psVar11,&targetOutputReal);
      cmOutputConverter::ConvertToOutputFormat
                (&target,&(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          super_cmOutputConverter,&targetFullPathCompilePDB,(uint)useWatcomQuote);
      std::__cxx11::string::~string((string *)&targetFullPathCompilePDB);
      cmCommonTargetGenerator::ComputeTargetCompilePDB_abi_cxx11_
                (&targetFullPathCompilePDB,(cmCommonTargetGenerator *)this);
      cmOutputConverter::ConvertToOutputFormat
                (&targetOutPathCompilePDB,
                 &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                  super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
                 &targetFullPathCompilePDB,SHELL);
      progress.Arg.field_2._M_allocated_capacity = (size_type)linkLanguage._M_dataplus._M_p;
      progress.Arg.field_2._8_8_ = buildObjs._M_dataplus._M_p;
      launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
      launcher._M_string_length = 0;
      progress.Dir.field_2._8_8_ = targetOutPathCompilePDB._M_dataplus._M_p;
      launcher.field_2._M_local_buf[0] = '\0';
      pcVar3 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget
      ;
      pcVar5 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"RULE_LAUNCH_LINK",(allocator<char> *)&rulePlaceholderExpander)
      ;
      pcVar9 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar5,pcVar3,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
        std::__cxx11::string::assign((char *)&launcher);
        std::__cxx11::string::append((char *)&launcher);
      }
      rulePlaceholderExpander._M_t.
      super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
      .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._0_4_ =
           (*(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator
             ).super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
      rulePlaceholderExpander._M_t.
      super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
      .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._4_4_ = extraout_var;
      std::__cxx11::string::_M_assign
                ((string *)
                 rulePlaceholderExpander._M_t.
                 super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                 .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl);
      pbVar2 = real_link_commands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__rhs = real_link_commands.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar2; __rhs = __rhs + 1) {
        std::operator+(&local_f0,&launcher,__rhs);
        std::__cxx11::string::operator=((string *)__rhs,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        pcVar5 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
        pcVar12 = &(pcVar5->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter;
        if (pcVar5 == (cmLocalUnixMakefileGenerator3 *)0x0) {
          pcVar12 = (cmOutputConverter *)0x0;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  ((cmRulePlaceholderExpander *)
                   rulePlaceholderExpander._M_t.
                   super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                   .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,pcVar12,
                   __rhs,(RuleVariables *)&progress);
      }
      cmOutputConverter::SetLinkScriptShell
                (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
                  super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,false
                );
      std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
      ~unique_ptr(&rulePlaceholderExpander);
      std::__cxx11::string::~string((string *)&launcher);
      std::__cxx11::string::~string((string *)&targetOutPathCompilePDB);
      std::__cxx11::string::~string((string *)&targetFullPathCompilePDB);
      std::__cxx11::string::~string((string *)&target);
      std::__cxx11::string::~string((string *)&objectDir);
      std::__cxx11::string::~string((string *)&buildObjs);
      std::__cxx11::string::~string((string *)&linkLibs);
      (*this_01->_vptr_cmLinkLineComputer[1])();
      if (bVar6 == false) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&commands1,&real_link_commands);
      }
      else {
        pcVar9 = "dlink.txt";
        if (relink) {
          pcVar9 = "drelink.txt";
        }
        cmMakefileTargetGenerator::CreateLinkScript
                  (&this->super_cmMakefileTargetGenerator,pcVar9,&real_link_commands,&commands1,
                   &depends);
      }
      pcVar5 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
      psVar11 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                          ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                           Makefile);
      psVar10 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                          ((cmLocalGenerator *)
                           (this->super_cmMakefileTargetGenerator).LocalGenerator);
      cmLocalUnixMakefileGenerator3::CreateCDCommand(pcVar5,&commands1,psVar11,psVar10);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                 (const_iterator)
                 commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )commands1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )commands1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&commands1);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                ((this->super_cmMakefileTargetGenerator).LocalGenerator,
                 (ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,(char *)0x0,
                 &targetOutputReal,&depends,&commands,false,false);
      cmMakefileTargetGenerator::WriteTargetDriverRule
                (&this->super_cmMakefileTargetGenerator,&targetOutputReal,relink);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(this->super_cmMakefileTargetGenerator).CleanFiles,
                 (this->super_cmMakefileTargetGenerator).CleanFiles.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )exeCleanFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )exeCleanFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands1);
      std::__cxx11::string::~string((string *)&linkRule);
      std::__cxx11::string::~string((string *)&linkRuleVar);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&real_link_commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&exeCleanFiles);
      std::__cxx11::string::~string((string *)&linkFlags);
      std::__cxx11::string::~string((string *)&flags);
      std::__cxx11::string::~string((string *)&targetOutputReal);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      std::__cxx11::string::~string((string *)&objExt);
      std::__cxx11::string::~string((string *)&linkLanguage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands);
    }
    std::__cxx11::string::~string((string *)&cuda_lang);
  }
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteDeviceExecutableRule(
  bool relink)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  if (!this->GlobalGenerator->GetLanguageEnabled("CUDA")) {
    return;
  }

  const std::string cuda_lang("CUDA");
  cmGeneratorTarget::LinkClosure const* closure =
    this->GeneratorTarget->GetLinkClosure(this->ConfigName);

  const bool hasCUDA =
    (std::find(closure->Languages.begin(), closure->Languages.end(),
               cuda_lang) != closure->Languages.end());

  bool doDeviceLinking = true;
  if (const char* resolveDeviceSymbols =
        this->GeneratorTarget->GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
    doDeviceLinking = cmSystemTools::IsOn(resolveDeviceSymbols);
  }
  if (!hasCUDA || !doDeviceLinking) {
    return;
  }

  std::vector<std::string> commands;

  // Get the language to use for linking this library.
  std::string linkLanguage = "CUDA";
  std::string const objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends, linkLanguage);

  // Get the name of the device object to generate.
  std::string const targetOutputReal =
    this->GeneratorTarget->ObjectDirectory + "cmake_device_link" + objExt;
  this->DeviceLinkObject = targetOutputReal;

  this->NumberOfProgressActions++;
  if (!this->NoRuleMessages) {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = "Linking ";
    buildEcho += linkLanguage;
    buildEcho += " device code ";
    buildEcho += this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(),
        this->DeviceLinkObject),
      cmOutputConverter::SHELL);
    this->LocalGenerator->AppendEcho(
      commands, buildEcho, cmLocalUnixMakefileGenerator3::EchoLink, &progress);
  }

  // Build a list of compiler flags and linker flags.
  std::string flags;
  std::string linkFlags;

  // Add flags to create an executable.
  // Add symbol export flags if necessary.
  if (this->GeneratorTarget->IsExecutableWithExports()) {
    std::string export_flag_var = "CMAKE_EXE_EXPORTS_";
    export_flag_var += linkLanguage;
    export_flag_var += "_FLAG";
    this->LocalGenerator->AppendFlags(
      linkFlags, this->Makefile->GetDefinition(export_flag_var));
  }

  this->LocalGenerator->AppendFlags(linkFlags,
                                    this->LocalGenerator->GetLinkLibsCMP0065(
                                      linkLanguage, *this->GeneratorTarget));

  // Add language feature flags.
  this->LocalGenerator->AddLanguageFlagsForLinking(
    flags, this->GeneratorTarget, linkLanguage, this->ConfigName);

  this->LocalGenerator->AddArchitectureFlags(flags, this->GeneratorTarget,
                                             linkLanguage, this->ConfigName);

  // Add target-specific linker flags.
  this->GetTargetLinkFlags(linkFlags, linkLanguage);

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> exeCleanFiles;
  exeCleanFiles.push_back(this->LocalGenerator->MaybeConvertToRelativePath(
    this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal));

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  // Construct the main link rule.
  std::vector<std::string> real_link_commands;
  const std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_EXECUTABLE";
  const std::string linkRule = this->GetLinkRule(linkRuleVar);
  std::vector<std::string> commands1;
  cmSystemTools::ExpandListArgument(linkRule, real_link_commands);

  bool useResponseFileForObjects =
    this->CheckUseResponseFileForObjects(linkLanguage);
  bool const useResponseFileForLibs =
    this->CheckUseResponseFileForLibraries(linkLanguage);

  // Expand the rule variables.
  {
    bool useWatcomQuote =
      this->Makefile->IsOn(linkRuleVar + "_USE_WATCOM_QUOTE");

    // Set path conversion for link script shells.
    this->LocalGenerator->SetLinkScriptShell(useLinkScript);

    std::unique_ptr<cmLinkLineComputer> linkLineComputer(
      new cmLinkLineDeviceComputer(
        this->LocalGenerator,
        this->LocalGenerator->GetStateSnapshot().GetDirectory()));
    linkLineComputer->SetForResponse(useResponseFileForLibs);
    linkLineComputer->SetUseWatcomQuote(useWatcomQuote);
    linkLineComputer->SetRelink(relink);

    // Collect up flags to link in needed libraries.
    std::string linkLibs;
    this->CreateLinkLibs(linkLineComputer.get(), linkLibs,
                         useResponseFileForLibs, depends);

    // Construct object file lists that may be needed to expand the
    // rule.
    std::string buildObjs;
    this->CreateObjectLists(useLinkScript, false, useResponseFileForObjects,
                            buildObjs, depends, useWatcomQuote);

    cmRulePlaceholderExpander::RuleVariables vars;
    std::string objectDir = this->GeneratorTarget->GetSupportDirectory();

    objectDir = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), objectDir),
      cmOutputConverter::SHELL);

    cmOutputConverter::OutputFormat output = (useWatcomQuote)
      ? cmOutputConverter::WATCOMQUOTE
      : cmOutputConverter::SHELL;
    std::string target = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal),
      output);

    std::string targetFullPathCompilePDB = this->ComputeTargetCompilePDB();
    std::string targetOutPathCompilePDB =
      this->LocalGenerator->ConvertToOutputFormat(targetFullPathCompilePDB,
                                                  cmOutputConverter::SHELL);

    vars.Language = linkLanguage.c_str();
    vars.Objects = buildObjs.c_str();
    vars.ObjectDir = objectDir.c_str();
    vars.Target = target.c_str();
    vars.LinkLibraries = linkLibs.c_str();
    vars.Flags = flags.c_str();
    vars.LinkFlags = linkFlags.c_str();
    vars.TargetCompilePDB = targetOutPathCompilePDB.c_str();

    std::string launcher;

    const char* val = this->LocalGenerator->GetRuleLauncher(
      this->GeneratorTarget, "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->LocalGenerator->CreateRulePlaceholderExpander());

    // Expand placeholders in the commands.
    rulePlaceholderExpander->SetTargetImpLib(targetOutputReal);
    for (std::string& real_link_command : real_link_commands) {
      real_link_command = launcher + real_link_command;
      rulePlaceholderExpander->ExpandRuleVariables(this->LocalGenerator,
                                                   real_link_command, vars);
    }

    // Restore path conversion to normal shells.
    this->LocalGenerator->SetLinkScriptShell(false);
  }

  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if (useLinkScript) {
    // Use a link script.
    const char* name = (relink ? "drelink.txt" : "dlink.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
  } else {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
  }
  this->LocalGenerator->CreateCDCommand(
    commands1, this->Makefile->GetCurrentBinaryDirectory(),
    this->LocalGenerator->GetBinaryDirectory());
  commands.insert(commands.end(), commands1.begin(), commands1.end());
  commands1.clear();

  // Write the build rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      targetOutputReal, depends, commands,
                                      false);

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetOutputReal, relink);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(this->CleanFiles.end(), exeCleanFiles.begin(),
                          exeCleanFiles.end());
#else
  static_cast<void>(relink);
#endif
}